

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint-c.cpp
# Opt level: O2

duckdb_hugeint duckdb_double_to_hugeint(double val)

{
  bool bVar1;
  duckdb_hugeint dVar2;
  hugeint_t internal_result;
  hugeint_t local_10;
  
  bVar1 = duckdb::Value::DoubleIsFinite(val);
  if ((!bVar1) || (bVar1 = duckdb::Hugeint::TryConvert<double>(val,&local_10), !bVar1)) {
    local_10.upper = 0;
    local_10.lower = 0;
  }
  dVar2.upper = local_10.upper;
  dVar2.lower = local_10.lower;
  return dVar2;
}

Assistant:

duckdb_hugeint duckdb_double_to_hugeint(double val) {
	hugeint_t internal_result;
	if (!Value::DoubleIsFinite(val) || !Hugeint::TryConvert<double>(val, internal_result)) {
		internal_result.lower = 0;
		internal_result.upper = 0;
	}

	duckdb_hugeint result;
	result.lower = internal_result.lower;
	result.upper = internal_result.upper;
	return result;
}